

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

MPP_RET fill_image(RK_U8 *buf,RK_U32 width,RK_U32 height,RK_U32 hor_stride,RK_U32 ver_stride,
                  MppFrameFormat fmt,RK_U32 frame_count)

{
  FillRgbFunc p_Var1;
  int iVar2;
  char cVar3;
  MppFrameFormat MVar4;
  RK_S32 RVar5;
  MPP_RET MVar6;
  char cVar7;
  RK_U8 *pRVar8;
  ulong uVar9;
  RK_U8 RVar10;
  ulong uVar11;
  RK_U32 RVar12;
  uint uVar13;
  undefined4 in_register_00000084;
  char *fmt_name;
  RK_U8 RVar14;
  uint uVar15;
  RK_U8 *pRVar16;
  uint uVar17;
  RK_U32 RVar18;
  RK_U8 *p;
  RK_U32 B;
  RK_U32 G;
  RK_U32 R;
  RK_U32 local_4c;
  RK_U32 local_48;
  RK_U32 local_44;
  FillRgbFunc local_40;
  ulong local_38;
  
  fmt_name = (char *)CONCAT44(in_register_00000084,ver_stride);
  uVar11 = (ulong)hor_stride;
  MVar4 = fmt & 0xfffff;
  uVar13 = MVar4 - MPP_FMT_RGB565;
  if (uVar13 < 0xe) {
    if ((0x3fU >> (uVar13 & 0x1f) & 1) == 0) {
      if ((0x3f00U >> (uVar13 & 0x1f) & 1) == 0) {
        p_Var1 = fill_rgb_funcs[fmt - MPP_FMT_RGB565];
        RVar5 = util_check_stride_by_pixel((uint)fill_image_is_pixel_stride,width,hor_stride,3);
        if (RVar5 != 0) {
          uVar11 = (ulong)(hor_stride * 3);
          fill_image_is_pixel_stride = 1;
        }
        RVar5 = util_check_8_pixel_aligned
                          ((uint)fill_image_not_8_pixel,(int)uVar11,3,0x10b060,fmt_name);
        if (RVar5 != 0) {
          uVar11 = (ulong)((((int)uVar11 + 0x17U) / 0x18) * 0x18);
          fill_image_not_8_pixel = 1;
        }
        if (height != 0) {
          RVar12 = 0;
          local_40 = p_Var1;
          local_38 = uVar11;
          do {
            if (width != 0) {
              RVar18 = 0;
              uVar11 = 0;
              do {
                get_rgb_color(&local_44,&local_48,&local_4c,RVar18,RVar12,frame_count);
                (*local_40)(buf + uVar11,local_44,local_48,local_4c,SUB14((fmt >> 0x18 & 1) == 0,0))
                ;
                RVar18 = RVar18 + 1;
                uVar11 = (ulong)((int)uVar11 + 3);
              } while (width != RVar18);
            }
            RVar12 = RVar12 + 1;
            buf = buf + local_38;
          } while (RVar12 != height);
        }
      }
      else {
        p_Var1 = fill_rgb_funcs[fmt - MPP_FMT_RGB565];
        RVar5 = util_check_stride_by_pixel((uint)fill_image_is_pixel_stride,width,hor_stride,4);
        if (RVar5 != 0) {
          uVar11 = (ulong)(hor_stride << 2);
          fill_image_is_pixel_stride = 1;
        }
        RVar5 = util_check_8_pixel_aligned
                          ((uint)fill_image_not_8_pixel,(int)uVar11,4,0x10b056,fmt_name);
        if (RVar5 != 0) {
          uVar11 = (ulong)((int)uVar11 + 0x1fU & 0xffffffe0);
          fill_image_not_8_pixel = 1;
        }
        if (height != 0) {
          RVar12 = 0;
          local_40 = p_Var1;
          local_38 = uVar11;
          do {
            if (width != 0) {
              RVar18 = 0;
              uVar11 = 0;
              do {
                get_rgb_color(&local_44,&local_48,&local_4c,RVar18,RVar12,frame_count);
                (*local_40)(buf + uVar11,local_44,local_48,local_4c,SUB14((fmt >> 0x18 & 1) == 0,0))
                ;
                RVar18 = RVar18 + 1;
                uVar11 = (ulong)((int)uVar11 + 4);
              } while (width != RVar18);
            }
            RVar12 = RVar12 + 1;
            buf = buf + local_38;
          } while (RVar12 != height);
        }
      }
    }
    else {
      p_Var1 = fill_rgb_funcs[fmt - MPP_FMT_RGB565];
      RVar5 = util_check_stride_by_pixel((uint)fill_image_is_pixel_stride,width,hor_stride,2);
      if (RVar5 != 0) {
        uVar11 = (ulong)(hor_stride * 2);
        fill_image_is_pixel_stride = 1;
      }
      RVar5 = util_check_8_pixel_aligned
                        ((uint)fill_image_not_8_pixel,(int)uVar11,2,0x10b04c,fmt_name);
      if (RVar5 != 0) {
        uVar11 = (ulong)((int)uVar11 + 0xfU & 0xfffffff0);
        fill_image_not_8_pixel = 1;
      }
      if (height != 0) {
        RVar12 = 0;
        local_40 = p_Var1;
        local_38 = uVar11;
        do {
          if (width != 0) {
            RVar18 = 0;
            uVar11 = 0;
            do {
              get_rgb_color(&local_44,&local_48,&local_4c,RVar18,RVar12,frame_count);
              (*local_40)(buf + uVar11,local_44,local_48,local_4c,SUB14((fmt >> 0x18 & 1) == 0,0));
              RVar18 = RVar18 + 1;
              uVar11 = (ulong)((int)uVar11 + 2);
            } while (width != RVar18);
          }
          RVar12 = RVar12 + 1;
          buf = buf + local_38;
        } while (RVar12 != height);
      }
    }
    goto LAB_001097b5;
  }
  if (MVar4 < MPP_FMT_YUV444SP_10BIT) {
    uVar13 = ver_stride * hor_stride;
    pRVar16 = buf + uVar13;
    cVar3 = (char)frame_count;
    switch(MVar4) {
    case MPP_FMT_YUV420SP:
      if (height != 0) {
        uVar13 = frame_count * 3 & 0xff;
        RVar12 = 0;
        do {
          if (width != 0) {
            uVar9 = 0;
            do {
              buf[uVar9] = (char)uVar13 + (char)uVar9;
              uVar9 = uVar9 + 1;
            } while (width != uVar9);
          }
          RVar12 = RVar12 + 1;
          buf = buf + uVar11;
          uVar13 = uVar13 + 1;
        } while (RVar12 != height);
      }
      if (1 < height) {
        uVar13 = 0;
        do {
          if (1 < width) {
            uVar9 = 0;
            do {
              pRVar16[uVar9 * 2] = ((byte)uVar13 ^ 0x80) + cVar3 * '\x02';
              pRVar16[uVar9 * 2 + 1] = cVar3 * '\x05' + '@' + (char)uVar9;
              uVar9 = uVar9 + 1;
            } while (width >> 1 != uVar9);
          }
          uVar13 = uVar13 + 1;
          pRVar16 = pRVar16 + uVar11;
        } while (uVar13 != height >> 1);
        return MPP_OK;
      }
      break;
    default:
      goto switchD_00108ddb_caseD_1;
    case MPP_FMT_YUV422SP:
      if (height != 0) {
        uVar13 = frame_count * 3 & 0xff;
        RVar12 = 0;
        do {
          if (width != 0) {
            uVar9 = 0;
            do {
              buf[uVar9] = (char)uVar13 + (char)uVar9;
              uVar9 = uVar9 + 1;
            } while (width != uVar9);
          }
          RVar12 = RVar12 + 1;
          buf = buf + uVar11;
          uVar13 = uVar13 + 1;
        } while (RVar12 != height);
        uVar13 = 0;
        do {
          if (1 < width) {
            uVar9 = 0;
            do {
              pRVar16[uVar9 * 2] = ((byte)(uVar13 >> 1) ^ 0x80) + cVar3 * '\x02';
              pRVar16[uVar9 * 2 + 1] = cVar3 * '\x05' + '@' + (char)uVar9;
              uVar9 = uVar9 + 1;
            } while (width >> 1 != uVar9);
          }
          uVar13 = uVar13 + 1;
          pRVar16 = pRVar16 + uVar11;
        } while (uVar13 != height);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV420P:
      if (height != 0) {
        uVar17 = frame_count * 3 & 0xff;
        RVar12 = 0;
        do {
          if (width != 0) {
            uVar9 = 0;
            do {
              buf[uVar9] = (char)uVar17 + (char)uVar9;
              uVar9 = uVar9 + 1;
            } while (width != uVar9);
          }
          RVar12 = RVar12 + 1;
          buf = buf + uVar11;
          uVar17 = uVar17 + 1;
        } while (RVar12 != height);
      }
      local_40 = (FillRgbFunc)uVar11;
      if (1 < height) {
        uVar17 = 0;
        pRVar8 = pRVar16;
        do {
          if (1 < width) {
            memset(pRVar8,(uVar17 ^ 0x80) + frame_count * 2,(ulong)((width >> 1) - 1) + 1);
          }
          uVar17 = uVar17 + 1;
          pRVar8 = pRVar8 + (hor_stride >> 1);
        } while (height >> 1 != uVar17);
      }
      if (1 < height) {
        pRVar16 = pRVar16 + (uVar13 >> 2);
        uVar13 = 0;
        do {
          if (1 < width) {
            uVar11 = 0;
            do {
              pRVar16[uVar11] = cVar3 * '\x05' + '@' + (char)uVar11;
              uVar11 = uVar11 + 1;
            } while (width >> 1 != uVar11);
          }
          uVar13 = uVar13 + 1;
          pRVar16 = pRVar16 + ((ulong)local_40 >> 1 & 0x7fffffff);
        } while (uVar13 != height >> 1);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV420SP_VU:
      if (height != 0) {
        uVar13 = frame_count * 3 & 0xff;
        RVar12 = 0;
        do {
          if (width != 0) {
            uVar9 = 0;
            do {
              buf[uVar9] = (char)uVar13 + (char)uVar9;
              uVar9 = uVar9 + 1;
            } while (width != uVar9);
          }
          RVar12 = RVar12 + 1;
          buf = buf + uVar11;
          uVar13 = uVar13 + 1;
        } while (RVar12 != height);
      }
      if (1 < height) {
        uVar13 = 0;
        do {
          if (1 < width) {
            uVar9 = 0;
            do {
              pRVar16[uVar9 * 2 + 1] = ((byte)uVar13 ^ 0x80) + cVar3 * '\x02';
              pRVar16[uVar9 * 2] = cVar3 * '\x05' + '@' + (char)uVar9;
              uVar9 = uVar9 + 1;
            } while (width >> 1 != uVar9);
          }
          uVar13 = uVar13 + 1;
          pRVar16 = pRVar16 + uVar11;
        } while (uVar13 != height >> 1);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV422P:
      if (height != 0) {
        cVar7 = cVar3 * '\x03';
        RVar12 = 0;
        do {
          if (width != 0) {
            uVar9 = 0;
            do {
              buf[uVar9] = cVar7 + (char)uVar9;
              uVar9 = uVar9 + 1;
            } while (width != uVar9);
          }
          RVar12 = RVar12 + 1;
          buf = buf + uVar11;
          cVar7 = cVar7 + '\x01';
        } while (RVar12 != height);
        local_40 = (FillRgbFunc)((ulong)((width >> 1) - 1) + 1);
        uVar17 = 0;
        pRVar8 = pRVar16;
        do {
          if (1 < width) {
            memset(pRVar8,(uVar17 >> 1 ^ 0x80) + frame_count * 2,(size_t)local_40);
          }
          uVar17 = uVar17 + 1;
          pRVar8 = pRVar8 + (hor_stride >> 1);
        } while (height != uVar17);
        pRVar16 = pRVar16 + (uVar13 >> 1);
        RVar12 = 0;
        do {
          if (1 < width) {
            uVar11 = 0;
            do {
              pRVar16[uVar11] = cVar3 * '\x05' + '@' + (char)uVar11;
              uVar11 = uVar11 + 1;
            } while (width >> 1 != uVar11);
          }
          RVar12 = RVar12 + 1;
          pRVar16 = pRVar16 + (hor_stride >> 1);
        } while (RVar12 != height);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV422SP_VU:
      if (height != 0) {
        uVar13 = frame_count * 3 & 0xff;
        RVar12 = 0;
        do {
          if (width != 0) {
            uVar9 = 0;
            do {
              buf[uVar9] = (char)uVar13 + (char)uVar9;
              uVar9 = uVar9 + 1;
            } while (width != uVar9);
          }
          RVar12 = RVar12 + 1;
          buf = buf + uVar11;
          uVar13 = uVar13 + 1;
        } while (RVar12 != height);
        uVar13 = 0;
        do {
          if (1 < width) {
            uVar9 = 0;
            do {
              pRVar16[uVar9 * 2 + 1] = ((byte)(uVar13 >> 1) ^ 0x80) + cVar3 * '\x02';
              pRVar16[uVar9 * 2] = cVar3 * '\x05' + '@' + (char)uVar9;
              uVar9 = uVar9 + 1;
            } while (width >> 1 != uVar9);
          }
          uVar13 = uVar13 + 1;
          pRVar16 = pRVar16 + uVar11;
        } while (uVar13 != height);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV422_YUYV:
      if (height != 0) {
        uVar13 = frame_count * 3;
        uVar17 = 0;
        do {
          if (1 < width) {
            uVar9 = 0;
            RVar10 = cVar3 * '\x05' + '@';
            uVar15 = uVar13;
            do {
              RVar14 = (RK_U8)uVar15;
              buf[uVar9 & 0xffffffff] = RVar14;
              iVar2 = (int)uVar9;
              buf[iVar2 + 2] = RVar14 + '\x01';
              buf[iVar2 + 1] = ((byte)(uVar17 >> 1) ^ 0x80) + cVar3 * '\x02';
              buf[iVar2 + 3] = RVar10;
              uVar15 = (uint)(byte)(RVar14 + 2);
              uVar9 = uVar9 + 4;
              RVar10 = RVar10 + '\x01';
            } while ((ulong)(width >> 1) << 2 != uVar9);
          }
          uVar17 = uVar17 + 1;
          buf = buf + uVar11;
          uVar13 = (uint)(byte)((char)uVar13 + 1);
        } while (uVar17 != height);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV422_YVYU:
      if (height != 0) {
        uVar13 = frame_count * 3;
        uVar17 = 0;
        do {
          if (1 < width) {
            uVar9 = 0;
            RVar10 = cVar3 * '\x05' + '@';
            uVar15 = uVar13;
            do {
              RVar14 = (RK_U8)uVar15;
              buf[uVar9 & 0xffffffff] = RVar14;
              iVar2 = (int)uVar9;
              buf[iVar2 + 2] = RVar14 + '\x01';
              buf[iVar2 + 3] = ((byte)(uVar17 >> 1) ^ 0x80) + cVar3 * '\x02';
              buf[iVar2 + 1] = RVar10;
              uVar15 = (uint)(byte)(RVar14 + 2);
              uVar9 = uVar9 + 4;
              RVar10 = RVar10 + '\x01';
            } while ((ulong)(width >> 1) << 2 != uVar9);
          }
          uVar17 = uVar17 + 1;
          buf = buf + uVar11;
          uVar13 = (uint)(byte)((char)uVar13 + 1);
        } while (uVar17 != height);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV422_UYVY:
      if (height != 0) {
        uVar13 = frame_count * 3;
        uVar17 = 0;
        do {
          if (1 < width) {
            uVar11 = 0;
            RVar10 = cVar3 * '\x05' + '@';
            uVar15 = uVar13;
            do {
              iVar2 = (int)uVar11;
              RVar14 = (RK_U8)uVar15;
              buf[iVar2 + 1] = RVar14;
              buf[iVar2 + 3] = RVar14 + '\x01';
              buf[uVar11 & 0xffffffff] = ((byte)(uVar17 >> 1) ^ 0x80) + cVar3 * '\x02';
              buf[iVar2 + 2] = RVar10;
              uVar15 = (uint)(byte)(RVar14 + 2);
              uVar11 = uVar11 + 4;
              RVar10 = RVar10 + '\x01';
            } while ((ulong)(width >> 1) << 2 != uVar11);
          }
          uVar17 = uVar17 + 1;
          buf = buf + hor_stride;
          uVar13 = (uint)(byte)((char)uVar13 + 1);
        } while (uVar17 != height);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV422_VYUY:
      if (height != 0) {
        uVar13 = frame_count * 3;
        uVar17 = 0;
        do {
          if (1 < width) {
            uVar11 = 0;
            RVar10 = cVar3 * '\x05' + '@';
            uVar15 = uVar13;
            do {
              iVar2 = (int)uVar11;
              RVar14 = (RK_U8)uVar15;
              buf[iVar2 + 1] = RVar14;
              buf[iVar2 + 3] = RVar14 + '\x01';
              buf[iVar2 + 2] = ((byte)(uVar17 >> 1) ^ 0x80) + cVar3 * '\x02';
              buf[uVar11 & 0xffffffff] = RVar10;
              uVar15 = (uint)(byte)(RVar14 + 2);
              uVar11 = uVar11 + 4;
              RVar10 = RVar10 + '\x01';
            } while ((ulong)(width >> 1) << 2 != uVar11);
          }
          uVar17 = uVar17 + 1;
          buf = buf + hor_stride;
          uVar13 = (uint)(byte)((char)uVar13 + 1);
        } while (uVar17 != height);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV400:
      if (height != 0) {
        uVar13 = frame_count * 3 & 0xff;
        RVar12 = 0;
        do {
          if (width != 0) {
            uVar11 = 0;
            do {
              buf[uVar11] = (char)uVar13 + (char)uVar11;
              uVar11 = uVar11 + 1;
            } while (width != uVar11);
          }
          RVar12 = RVar12 + 1;
          buf = buf + hor_stride;
          uVar13 = uVar13 + 1;
        } while (RVar12 != height);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV444SP:
      if (height != 0) {
        uVar13 = frame_count * 3 & 0xff;
        RVar12 = 0;
        do {
          if (width != 0) {
            uVar11 = 0;
            do {
              buf[uVar11] = (char)uVar13 + (char)uVar11;
              uVar11 = uVar11 + 1;
            } while (width != uVar11);
          }
          RVar12 = RVar12 + 1;
          buf = buf + hor_stride;
          uVar13 = uVar13 + 1;
        } while (RVar12 != height);
        uVar13 = 0;
        do {
          if (width != 0) {
            uVar11 = 0;
            RVar10 = cVar3 * '\x05' + '@';
            do {
              pRVar16[uVar11 & 0xffffffff] = ((byte)(uVar13 >> 1) ^ 0x80) + cVar3 * '\x02';
              pRVar16[(int)uVar11 + 1] = RVar10;
              uVar11 = uVar11 + 2;
              RVar10 = RVar10 + '\x01';
            } while ((ulong)width * 2 != uVar11);
          }
          uVar13 = uVar13 + 1;
          pRVar16 = pRVar16 + hor_stride * 2;
        } while (uVar13 != height);
        return MPP_OK;
      }
      break;
    case MPP_FMT_YUV444P:
      if (height != 0) {
        uVar11 = (ulong)width;
        uVar17 = frame_count * 3 & 0xff;
        RVar12 = 0;
        pRVar8 = buf;
        do {
          if (width != 0) {
            uVar9 = 0;
            do {
              pRVar8[uVar9] = (char)uVar17 + (char)uVar9;
              uVar9 = uVar9 + 1;
            } while (uVar11 != uVar9);
          }
          RVar12 = RVar12 + 1;
          pRVar8 = pRVar8 + hor_stride;
          uVar17 = uVar17 + 1;
        } while (RVar12 != height);
        uVar17 = 0;
        do {
          if (width != 0) {
            memset(pRVar16,(uVar17 >> 1 ^ 0x80) + frame_count * 2,uVar11);
          }
          uVar17 = uVar17 + 1;
          pRVar16 = pRVar16 + hor_stride;
        } while (height != uVar17);
        pRVar16 = buf + uVar13 * 2;
        RVar12 = 0;
        do {
          if (width != 0) {
            uVar9 = 0;
            do {
              pRVar16[uVar9] = cVar3 * '\x05' + '@' + (char)uVar9;
              uVar9 = uVar9 + 1;
            } while (uVar11 != uVar9);
          }
          RVar12 = RVar12 + 1;
          pRVar16 = pRVar16 + hor_stride;
        } while (RVar12 != height);
        return MPP_OK;
      }
    }
LAB_001097b5:
    MVar6 = MPP_OK;
  }
  else {
switchD_00108ddb_caseD_1:
    _mpp_log_l(2,"utils","filling function do not support type %d\n","fill_image",fmt);
    MVar6 = MPP_NOK;
  }
  return MVar6;
}

Assistant:

MPP_RET fill_image(RK_U8 *buf, RK_U32 width, RK_U32 height,
                   RK_U32 hor_stride, RK_U32 ver_stride, MppFrameFormat fmt,
                   RK_U32 frame_count)
{
    MPP_RET ret = MPP_OK;
    RK_U8 *buf_y = buf;
    RK_U8 *buf_c = buf + hor_stride * ver_stride;
    RK_U32 x, y, i;
    static RK_S32 is_pixel_stride = 0;
    static RK_S32 not_8_pixel = 0;

    switch (fmt & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420SP : {
        fill_MPP_FMT_YUV420SP(buf, width, height, hor_stride, ver_stride, frame_count);
    } break;
    case MPP_FMT_YUV422SP : {
        fill_MPP_FMT_YUV422SP(buf, width, height, hor_stride, ver_stride, frame_count);
    } break;
    case MPP_FMT_YUV420P : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf_c;
        for (y = 0; y < height / 2; y++, p += hor_stride / 2) {
            for (x = 0; x < width / 2; x++) {
                p[x] = 128 + y + frame_count * 2;
            }
        }

        p = buf_c + hor_stride * ver_stride / 4;
        for (y = 0; y < height / 2; y++, p += hor_stride / 2) {
            for (x = 0; x < width / 2; x++) {
                p[x] = 64 + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV420SP_VU : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf_c;
        for (y = 0; y < height / 2; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 2 + 1] = 128 + y + frame_count * 2;
                p[x * 2 + 0] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422P : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf_c;
        for (y = 0; y < height; y++, p += hor_stride / 2) {
            for (x = 0; x < width / 2; x++) {
                p[x] = 128 + y / 2 + frame_count * 2;
            }
        }

        p = buf_c + hor_stride * ver_stride / 2;
        for (y = 0; y < height; y++, p += hor_stride / 2) {
            for (x = 0; x < width / 2; x++) {
                p[x] = 64 + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422SP_VU : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf_c;
        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 2 + 1] = 128 + y / 2 + frame_count * 2;
                p[x * 2 + 0] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422_YUYV : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 4 + 0] = x * 2 + 0 + y + frame_count * 3;
                p[x * 4 + 2] = x * 2 + 1 + y + frame_count * 3;
                p[x * 4 + 1] = 128 + y / 2 + frame_count * 2;
                p[x * 4 + 3] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422_YVYU : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 4 + 0] = x * 2 + 0 + y + frame_count * 3;
                p[x * 4 + 2] = x * 2 + 1 + y + frame_count * 3;
                p[x * 4 + 3] = 128 + y / 2 + frame_count * 2;
                p[x * 4 + 1] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422_UYVY : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 4 + 1] = x * 2 + 0 + y + frame_count * 3;
                p[x * 4 + 3] = x * 2 + 1 + y + frame_count * 3;
                p[x * 4 + 0] = 128 + y / 2 + frame_count * 2;
                p[x * 4 + 2] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422_VYUY : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 4 + 1] = x * 2 + 0 + y + frame_count * 3;
                p[x * 4 + 3] = x * 2 + 1 + y + frame_count * 3;
                p[x * 4 + 2] = 128 + y / 2 + frame_count * 2;
                p[x * 4 + 0] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV400 : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }
    } break;
    case MPP_FMT_YUV444SP : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf + hor_stride * ver_stride;
        for (y = 0; y < height; y++, p += hor_stride * 2) {
            for (x = 0; x < width; x++) {
                p[x * 2 + 0] = 128 + y / 2 + frame_count * 2;
                p[x * 2 + 1] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV444P : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }
        p = buf + hor_stride * ver_stride;
        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = 128 + y / 2 + frame_count * 2;
            }
        }
        p = buf + hor_stride * ver_stride * 2;
        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_RGB565 :
    case MPP_FMT_BGR565 :
    case MPP_FMT_RGB555 :
    case MPP_FMT_BGR555 :
    case MPP_FMT_RGB444 :
    case MPP_FMT_BGR444 : {
        RK_U8 *p = buf_y;
        RK_U32 pix_w = 2;
        FillRgbFunc fill = fill_rgb_funcs[fmt - MPP_FRAME_FMT_RGB];

        if (util_check_stride_by_pixel(is_pixel_stride, width, hor_stride, pix_w)) {
            hor_stride *= pix_w;
            is_pixel_stride = 1;
        }

        if (util_check_8_pixel_aligned(not_8_pixel, hor_stride,
                                       8, pix_w, "16bit RGB")) {
            hor_stride = MPP_ALIGN(hor_stride, 16);
            not_8_pixel = 1;
        }

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0, i = 0; x < width; x++, i += pix_w) {
                RK_U32 R, G, B;

                get_rgb_color(&R, &G, &B, x, y, frame_count);
                fill(p + i, R, G, B, MPP_FRAME_FMT_IS_BE(fmt));
            }
        }
    } break;
    case MPP_FMT_RGB101010 :
    case MPP_FMT_BGR101010 :
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGBA8888 : {
        RK_U8 *p = buf_y;
        RK_U32 pix_w = 4;
        FillRgbFunc fill = fill_rgb_funcs[fmt - MPP_FRAME_FMT_RGB];

        if (util_check_stride_by_pixel(is_pixel_stride, width, hor_stride, pix_w)) {
            hor_stride *= pix_w;
            is_pixel_stride = 1;
        }

        if (util_check_8_pixel_aligned(not_8_pixel, hor_stride,
                                       8, pix_w, "32bit RGB")) {
            hor_stride = MPP_ALIGN(hor_stride, 32);
            not_8_pixel = 1;
        }

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0, i = 0; x < width; x++, i += pix_w) {
                RK_U32 R, G, B;

                get_rgb_color(&R, &G, &B, x, y, frame_count);
                fill(p + i, R, G, B, MPP_FRAME_FMT_IS_BE(fmt));
            }
        }
    } break;
    case MPP_FMT_BGR888 :
    case MPP_FMT_RGB888 : {
        RK_U8 *p = buf_y;
        RK_U32 pix_w = 3;
        FillRgbFunc fill = fill_rgb_funcs[fmt - MPP_FRAME_FMT_RGB];

        if (util_check_stride_by_pixel(is_pixel_stride, width, hor_stride, pix_w)) {
            hor_stride *= pix_w;
            is_pixel_stride = 1;
        }

        if (util_check_8_pixel_aligned(not_8_pixel, hor_stride,
                                       8, pix_w, "24bit RGB")) {
            hor_stride = MPP_ALIGN_GEN(hor_stride, 24);
            not_8_pixel = 1;
        }

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0, i = 0; x < width; x++, i += pix_w) {
                RK_U32 R, G, B;

                get_rgb_color(&R, &G, &B, x, y, frame_count);
                fill(p + i, R, G, B, MPP_FRAME_FMT_IS_BE(fmt));
            }
        }
    } break;
    default : {
        mpp_err_f("filling function do not support type %d\n", fmt);
        ret = MPP_NOK;
    } break;
    }
    return ret;
}